

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

type fmt::v5::
     visit_format_arg<fmt::v5::internal::arg_converter<short,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
               (arg_converter<short,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                *vis,basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                     *arg)

{
  char cVar1;
  int iVar2;
  basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  *pbVar3;
  ushort uVar4;
  ulong uVar5;
  type tVar6;
  
  switch(arg->type_) {
  case int_type:
  case uint_type:
    uVar4 = *(ushort *)&(arg->value_).field_0;
    uVar5 = (ulong)uVar4;
    if ((vis->type_ == 'i') || (vis->type_ == 'd')) {
LAB_00135185:
      uVar5 = (ulong)(uint)(int)(short)uVar4;
      goto LAB_00135186;
    }
    break;
  case long_long_type:
  case ulong_long_type:
    uVar4 = (ushort)(arg->value_).field_0.long_long_value;
    if ((vis->type_ == 'i') || (vis->type_ == 'd')) goto LAB_00135185;
LAB_001351c7:
    uVar5 = (ulong)uVar4;
    break;
  case bool_type:
    iVar2 = (arg->value_).field_0.int_value;
    cVar1 = vis->type_;
    if (cVar1 != 'd') {
      if (cVar1 == 's') {
        return;
      }
      if (cVar1 != 'i') {
        uVar5 = (ulong)(iVar2 != 0);
        break;
      }
    }
    uVar5 = (ulong)(iVar2 != 0);
    goto LAB_00135186;
  case char_type:
    cVar1 = *(char *)&(arg->value_).field_0;
    if ((vis->type_ != 'i') && (vis->type_ != 'd')) {
      uVar4 = (ushort)cVar1;
      goto LAB_001351c7;
    }
    uVar5 = (ulong)(uint)(int)cVar1;
LAB_00135186:
    tVar6 = int_type;
    goto LAB_001351d8;
  default:
    goto switchD_0013515f_default;
  }
  tVar6 = uint_type;
LAB_001351d8:
  pbVar3 = vis->arg_;
  *(ulong *)&(pbVar3->value_).field_0 = uVar5;
  pbVar3->type_ = tVar6;
switchD_0013515f_default:
  return;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}